

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::FastBinaryPacking<32U>::decodeArray
          (FastBinaryPacking<32U> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint32_t *puVar1;
  uint bit;
  uint32_t uVar2;
  uint32_t *out_00;
  uint32_t *in_00;
  uint32_t i;
  long lVar3;
  uint32_t Bs [4];
  uint local_58 [6];
  uint32_t *local_40;
  size_t *local_38;
  
  in_00 = in + 1;
  local_40 = out;
  local_38 = nvalue;
  if ((ulong)*in != 0) {
    puVar1 = out + *in;
    do {
      lVar3 = 0;
      local_58[0] = (uint)*(byte *)((long)in_00 + 3);
      local_58[1] = (uint)*(byte *)((long)in_00 + 2);
      local_58[2] = (uint)*(byte *)((long)in_00 + 1);
      uVar2 = *in_00;
      in_00 = in_00 + 1;
      local_58[3] = (uint)(byte)uVar2;
      out_00 = out;
      do {
        bit = local_58[lVar3];
        fastunpack(in_00,out_00,bit);
        in_00 = in_00 + bit;
        lVar3 = lVar3 + 1;
        out_00 = out_00 + 0x20;
      } while (lVar3 != 4);
      out = out + 0x80;
    } while (out < puVar1);
  }
  *local_38 = (long)out - (long)local_40 >> 2;
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength; out += BlockSize) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          in = fastunpack_8(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 16)
          in = fastunpack_16(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 24)
          in = fastunpack_24(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastunpack(in, out + i * MiniBlockSize, Bs[i]);
          in += Bs[i];
        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
    return in;
  }